

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int pairsmeta(lua_State *L,char *method,int iszero,lua_CFunction iter)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  
  luaL_checkany(L,1);
  iVar1 = luaL_getmetafield(L,1,method);
  if (iVar1 != 0) {
    lua_pushvalue(L,1);
    lua_callk(L,1,3,0,(lua_KFunction)0x0);
    return extraout_EAX;
  }
  lua_pushcclosure(L,iter,0);
  lua_pushvalue(L,1);
  if (iszero != 0) {
    lua_pushinteger(L,0);
    return extraout_EAX_00;
  }
  lua_pushnil(L);
  return extraout_EAX_01;
}

Assistant:

static int pairsmeta (lua_State *L, const char *method, int iszero,
                      lua_CFunction iter) {
  luaL_checkany(L, 1);
  if (luaL_getmetafield(L, 1, method) == LUA_TNIL) {  /* no metamethod? */
    lua_pushcfunction(L, iter);  /* will return generator, */
    lua_pushvalue(L, 1);  /* state, */
    if (iszero) lua_pushinteger(L, 0);  /* and initial value */
    else lua_pushnil(L);
  }
  else {
    lua_pushvalue(L, 1);  /* argument 'self' to metamethod */
    lua_call(L, 1, 3);  /* get 3 values from metamethod */
  }
  return 3;
}